

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O2

bool __thiscall
GlobOpt::GetHash(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,
                ExprAttributes exprAttributes,ExprHash *pHash)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JITTimeFunctionBody *pJVar4;
  char16 *pcVar5;
  ValueNumber src2Val_00;
  ValueNumber src1Val_00;
  OpCode opcode;
  
  opcode = instr->m_opcode;
  bVar1 = OpCodeAttr::CanCSE(opcode);
  if (((!bVar1) && (opcode != StElemI_A_Strict)) && (opcode != StElemI_A)) {
    return false;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    if (src1Val != (Value *)0x0) goto LAB_00467f99;
    src1Val_00 = 0;
LAB_00467fa9:
    src2Val_00 = 0;
  }
  else {
    if (src1Val == (Value *)0x0) {
      return false;
    }
    if (instr->m_src2 == (Opnd *)0x0) {
LAB_00467f99:
      src1Val_00 = src1Val->valueNumber;
      if (src2Val == (Value *)0x0) goto LAB_00467fa9;
    }
    else {
      if (src2Val == (Value *)0x0) {
        return false;
      }
      src1Val_00 = src1Val->valueNumber;
    }
    src2Val_00 = src2Val->valueNumber;
  }
  switch(opcode) {
  case Neg_I4:
    opcode = Neg_A;
    break;
  case Not_I4:
    opcode = Not_A;
    break;
  case Add_I4:
    opcode = Add_A;
    break;
  case Sub_I4:
    opcode = Sub_A;
    break;
  case Mul_I4:
    opcode = Mul_A;
    break;
  case Div_I4:
    opcode = Div_A;
    break;
  case DivU_I4:
  case RemU_I4:
  case Rol_I4:
  case Ror_I4:
  case CmUnGe_A:
  case CmUnGt_A:
  case CmUnLt_A:
  case CmUnLe_A:
  case ToVar:
  case FromVar:
  case Conv_Prim:
  case Conv_Prim_Sat:
  case Conv_Bool:
  case Reinterpret_Prim:
  case TrapIfTruncOverflow:
    break;
  case Rem_I4:
    opcode = Rem_A;
    break;
  case And_I4:
    opcode = And_A;
    break;
  case Or_I4:
    opcode = Or_A;
    break;
  case Xor_I4:
    opcode = Xor_A;
    break;
  case Shl_I4:
    opcode = Shl_A;
    break;
  case Shr_I4:
    opcode = Shr_A;
    break;
  case ShrU_I4:
    opcode = ShrU_A;
    break;
  case CmEq_I4:
    opcode = CmEq_A;
    break;
  case CmNeq_I4:
    opcode = CmNeq_A;
    break;
  case CmLt_I4:
    opcode = CmLt_A;
    break;
  case CmLe_I4:
    opcode = CmLe_A;
    break;
  case CmGt_I4:
    opcode = CmGt_A;
    break;
  case CmGe_I4:
    opcode = CmGe_A;
    break;
  case CmUnLt_I4:
    opcode = CmUnLt_A;
    break;
  case CmUnLe_I4:
    opcode = CmUnLe_A;
    break;
  case CmUnGt_I4:
    opcode = CmUnGt_A;
    break;
  case CmUnGe_I4:
    opcode = CmUnGe_A;
    break;
  case Ld_I4:
    return false;
  default:
    if (opcode == Ld_A) {
      return false;
    }
    if ((opcode == StElemI_A) || (opcode == StElemI_A_Strict)) {
      opcode = LdElemI_A;
    }
  }
  ExprHash::Init(pHash,opcode,src1Val_00,src2Val_00,exprAttributes);
  if (*(char *)pHash == '\0') {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,CSEPhase,uVar2,uVar3);
    if (bVar1) {
      pJVar4 = Func::GetJITFunctionBody(this->func);
      pcVar5 = JITTimeFunctionBody::GetDisplayName(pJVar4);
      Output::Print(L" >>>>  CSE: Value numbers too big to be hashed in function %s!\n",pcVar5);
    }
  }
  if (*(char *)pHash == '\0') {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,CSEPhase,uVar2,uVar3);
    if (bVar1) {
      pJVar4 = Func::GetJITFunctionBody(this->func);
      pcVar5 = JITTimeFunctionBody::GetDisplayName(pJVar4);
      Output::Print(L" >>>>  CSE: Value numbers too big to be hashed in function %s!\n",pcVar5);
    }
  }
  return *(char *)pHash != '\0';
}

Assistant:

bool
GlobOpt::GetHash(IR::Instr *instr, Value *src1Val, Value *src2Val, ExprAttributes exprAttributes, ExprHash *pHash)
{
    Js::OpCode opcode = instr->m_opcode;

    // Candidate?
    if (!OpCodeAttr::CanCSE(opcode) && (opcode != Js::OpCode::StElemI_A && opcode != Js::OpCode::StElemI_A_Strict))
    {
        return false;
    }

    ValueNumber valNum1 = 0;
    ValueNumber valNum2 = 0;

    // Get the value number of src1 and src2
    if (instr->GetSrc1())
    {
        if (!src1Val)
        {
            return false;
        }
        valNum1 = src1Val->GetValueNumber();
        if (instr->GetSrc2())
        {
            if (!src2Val)
            {
                return false;
            }
            valNum2 = src2Val->GetValueNumber();
        }
    }

    if (src1Val)
    {
        valNum1 = src1Val->GetValueNumber();
        if (src2Val)
        {
            valNum2 = src2Val->GetValueNumber();
        }
    }

    switch (opcode)
    {
    case Js::OpCode::Ld_I4:
    case Js::OpCode::Ld_A:
        // Copy-prop should handle these
        return false;
    case Js::OpCode::Add_I4:
        opcode = Js::OpCode::Add_A;
        break;
    case Js::OpCode::Sub_I4:
        opcode = Js::OpCode::Sub_A;
        break;
    case Js::OpCode::Mul_I4:
        opcode = Js::OpCode::Mul_A;
        break;
    case Js::OpCode::Rem_I4:
        opcode = Js::OpCode::Rem_A;
        break;
    case Js::OpCode::Div_I4:
        opcode = Js::OpCode::Div_A;
        break;
    case Js::OpCode::Neg_I4:
        opcode = Js::OpCode::Neg_A;
        break;
    case Js::OpCode::Not_I4:
        opcode = Js::OpCode::Not_A;
        break;
    case Js::OpCode::And_I4:
        opcode = Js::OpCode::And_A;
        break;
    case Js::OpCode::Or_I4:
        opcode = Js::OpCode::Or_A;
        break;
    case Js::OpCode::Xor_I4:
        opcode = Js::OpCode::Xor_A;
        break;
    case Js::OpCode::Shl_I4:
        opcode = Js::OpCode::Shl_A;
        break;
    case Js::OpCode::Shr_I4:
        opcode = Js::OpCode::Shr_A;
        break;
    case Js::OpCode::ShrU_I4:
        opcode = Js::OpCode::ShrU_A;
        break;
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        // Make the load available as a CSE
        opcode = Js::OpCode::LdElemI_A;
        break;
    case Js::OpCode::CmEq_I4:
        opcode = Js::OpCode::CmEq_A;
        break;
    case Js::OpCode::CmNeq_I4:
        opcode = Js::OpCode::CmNeq_A;
        break;
    case Js::OpCode::CmLt_I4:
        opcode = Js::OpCode::CmLt_A;
        break;
    case Js::OpCode::CmLe_I4:
        opcode = Js::OpCode::CmLe_A;
        break;
    case Js::OpCode::CmGt_I4:
        opcode = Js::OpCode::CmGt_A;
        break;
    case Js::OpCode::CmGe_I4:
        opcode = Js::OpCode::CmGe_A;
        break;
    case Js::OpCode::CmUnLt_I4:
        opcode = Js::OpCode::CmUnLt_A;
        break;
    case Js::OpCode::CmUnLe_I4:
        opcode = Js::OpCode::CmUnLe_A;
        break;
    case Js::OpCode::CmUnGt_I4:
        opcode = Js::OpCode::CmUnGt_A;
        break;
    case Js::OpCode::CmUnGe_I4:
        opcode = Js::OpCode::CmUnGe_A;
        break;
    }

    pHash->Init(opcode, valNum1, valNum2, exprAttributes);

#if DBG_DUMP
    if (!pHash->IsValid() && Js::Configuration::Global.flags.Trace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" >>>>  CSE: Value numbers too big to be hashed in function %s!\n"), this->func->GetJITFunctionBody()->GetDisplayName());
    }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (!pHash->IsValid() && Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" >>>>  CSE: Value numbers too big to be hashed in function %s!\n"), this->func->GetJITFunctionBody()->GetDisplayName());
    }
#endif

    return pHash->IsValid();
}